

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void add2P(int v)

{
  _WordT *p_Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  uVar8 = (ulong)v;
  if (14999 < (uint)v) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar8,15000);
  }
  p_Var1 = P.super__Base_bitset<235UL>._M_w + (uVar8 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
  sizeP = sizeP + 1;
  if ((Cp.super__Base_bitset<235UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
    std::bitset<15000UL>::reset(&Cm,uVar8);
    piVar4 = NAdjB;
    CE_Cm_Cm = CE_Cm_Cm - CE_Cm_[uVar8];
    CE_Cm_Cp = CE_Cm_Cp - CE_Cp_[uVar8];
    iVar5 = NAdjP[uVar8];
    iVar7 = NAdjP[(ulong)(uint)v + 1];
    lVar11 = (ulong)(uint)v + 1;
    if (iVar5 < iVar7) {
      lVar10 = (long)iVar5;
      do {
        CE_Cm_[piVar4[lVar10]] = CE_Cm_[piVar4[lVar10]] + -1;
        lVar10 = lVar10 + 1;
      } while (iVar7 != lVar10);
    }
  }
  else {
    std::bitset<15000UL>::reset(&Cp,uVar8);
    piVar4 = NAdjB;
    CE_Cp_Cp = CE_Cp_Cp - CE_Cp_[uVar8];
    CE_Cp_P = CE_Cp_P - CE_P_[uVar8];
    CE_Cm_Cp = CE_Cm_Cp - CE_Cm_[uVar8];
    iVar5 = NAdjP[uVar8];
    iVar7 = NAdjP[(ulong)(uint)v + 1];
    lVar11 = (ulong)(uint)v + 1;
    if (iVar5 < iVar7) {
      lVar10 = (long)iVar5;
      do {
        CE_Cp_[piVar4[lVar10]] = CE_Cp_[piVar4[lVar10]] + -1;
        lVar10 = lVar10 + 1;
      } while (iVar7 != lVar10);
    }
  }
  sizeC = sizeC + -1;
  CE_P_P = CE_P_P + CE_P_[uVar8];
  lVar10 = (long)cnt_lP;
  cnt_lP = cnt_lP + 1;
  lP[lVar10] = v;
  piVar6 = AdjB;
  lVar10 = (long)AdjP[uVar8];
  iVar2 = AdjP[lVar11];
  if (AdjP[uVar8] < iVar2) {
    do {
      iVar3 = piVar6[lVar10];
      neiC[iVar3] = neiC[iVar3] + -1;
      neiP[iVar3] = neiP[iVar3] + 1;
      lVar10 = lVar10 + 1;
    } while (iVar2 != lVar10);
  }
  if (iVar5 < iVar7) {
    lVar9 = (long)iVar5;
    piVar6 = piVar4 + lVar9;
    lVar10 = lVar9 * 4;
    do {
      lVar10 = lVar10 + 4;
      iVar5 = *piVar6;
      uVar8 = (ulong)iVar5;
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        if ((Cp.super__Base_bitset<235UL>._M_w[uVar8 >> 6] & 1L << ((byte)iVar5 & 0x3f)) != 0) {
          CE_Cp_P = CE_Cp_P + 1;
        }
        piVar6 = CE_P_ + uVar8;
      }
      else {
        CE_Cp_P = CE_Cp_P + 1;
        piVar6 = CE_P_ + uVar8;
        if (*piVar6 == 0) {
          add_from_Cm_to_Cp(iVar5);
          iVar7 = NAdjP[lVar11];
          piVar4 = NAdjB;
        }
      }
      *piVar6 = *piVar6 + 1;
      lVar9 = lVar9 + 1;
      piVar6 = (int *)((long)piVar4 + lVar10);
    } while (lVar9 < iVar7);
  }
  return;
}

Assistant:

inline void add2P(int v) {
    P.set(v); ++sizeP;
    if(Cp[v]) {Cp.reset(v); out_Cp(v);}
    else {Cm.reset(v); out_Cm(v);}
    --sizeC;

    CE_P_P += CE_P_[v];
    lP[cnt_lP++] = v;

    FOR_NA(v, u) {--neiC[u]; ++neiP[u];}

    FOR_C_NA(v, u) {
        if (Cm[u] || Cp[u]) ++CE_Cp_P;
        if (CE_P_[u] == 0 && Cm[u])
            add_from_Cm_to_Cp(u);
        ++CE_P_[u];
    }
}